

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TabularDataFile.cpp
# Opt level: O2

void __thiscall
asl::TabularDataFile::TabularDataFile
          (TabularDataFile *this,String *filename,Array<asl::String> *cols)

{
  String *ctx;
  
  (this->_file).super_File._file = (FILE *)0x0;
  (this->_file).super_File._path._size = 0;
  (this->_file).super_File._path._len = 0;
  (this->_file).super_File._path.field_2._space[0] = '\0';
  (this->_file).super_File._info.size = -1;
  (this->_file).super_File._info.flags = 0;
  (this->_file).super_File._info.lastModified._t = 0.0;
  (this->_file).super_File._info.creationDate._t = 0.0;
  (this->_file).super_File._endian = ENDIAN_NATIVE;
  ctx = filename;
  Array<asl::String>::Array(&this->_columnNames);
  Array<asl::Var>::Array(&this->_row);
  (this->_currentLine).field_2._space[0] = '\0';
  (this->_currentLine)._size = 0;
  (this->_currentLine)._len = 0;
  Array<asl::String>::Array(&this->_currentRowParts);
  (this->_name)._size = 0;
  (this->_name)._len = 0;
  (this->_name).field_2._space[0] = '\0';
  (this->_types).field_2._space[0] = '\0';
  (this->_types)._size = 0;
  (this->_types)._len = 0;
  (this->_equote).field_2._space[0] = '\0';
  (this->_equote)._size = 0;
  (this->_equote)._len = 0;
  init(this,(EVP_PKEY_CTX *)ctx);
  String::operator=(&this->_name,filename);
  columns(this,cols);
  return;
}

Assistant:

TabularDataFile::TabularDataFile(const String& filename, const Array<String>& cols)
{
	init();
	_name = filename;
	columns(cols);
}